

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::EndRead3dmUserTable(ON_BinaryArchive *this)

{
  ON_3DM_BIG_CHUNK *pOVar1;
  bool bVar2;
  bool bVar3;
  char *sFormat;
  int line_number;
  uint tcode;
  ON__INT64 big_value;
  
  if ((this->m_chunk).m_count != 2) {
    sFormat = "ON_BinaryArchive::EndRead3dmUserTable() m_chunk.Count() != 2";
    line_number = 0x3f8e;
LAB_003d8e90:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,line_number,"",sFormat);
    return false;
  }
  pOVar1 = (this->m_chunk).m_a;
  if ((pOVar1 == (ON_3DM_BIG_CHUNK *)0xffffffffffffffd8) || (pOVar1[1].m_typecode != 0x20000081)) {
    sFormat = "ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != TCODE_USER_RECORD";
    line_number = 0x3f93;
    goto LAB_003d8e90;
  }
  bVar2 = EndRead3dmChunk(this,true);
  if (bVar2) {
    tcode = 0;
    big_value = -1;
    bVar2 = BeginRead3dmBigChunk(this,&tcode,&big_value);
    if (bVar2) {
      if (tcode != 0xffffffff) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x3fa4,"","ON_BinaryArchive::EndRead3dmTable() missing TCODE_ENDOFTABLE marker."
                  );
      }
      bVar2 = EndRead3dmChunk(this);
      goto LAB_003d8ea2;
    }
  }
  bVar2 = false;
LAB_003d8ea2:
  bVar3 = EndRead3dmTable(this,0x10000017);
  return (bool)(bVar3 & bVar2);
}

Assistant:

bool ON_BinaryArchive::EndRead3dmUserTable()
{
  if ( m_chunk.Count() != 2 ) {
    ON_ERROR("ON_BinaryArchive::EndRead3dmUserTable() m_chunk.Count() != 2");
    return false;
  }
  const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( 0 == c || c->m_typecode != TCODE_USER_RECORD ) {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != TCODE_USER_RECORD");
    return false;
  }


  // end of TCODE_USER_RECORD chunk
  // Suppress the partially read chunk warning because plug-in IO
  // is too upredictable for this warning to be helpful.
  bool rc = EndRead3dmChunk(true); 

  if (rc) {
    // end of table chunk
    unsigned int tcode = 0;
    ON__INT64 big_value = -1;
    rc = BeginRead3dmBigChunk( &tcode, &big_value );
    if ( rc ) {
      if ( tcode != TCODE_ENDOFTABLE ) {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() missing TCODE_ENDOFTABLE marker.");
      }
      if ( !EndRead3dmChunk() )
        rc = false;
    }
  }

  if ( !EndRead3dmTable(TCODE_USER_TABLE) )
    rc = false;
  return rc;
}